

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O0

long __thiscall FileReaderLZSS::Read(FileReaderLZSS *this,void *buffer,long len)

{
  uint uVar1;
  bool bVar2;
  long lStack_30;
  uint copy;
  long AvailOut;
  BYTE *Out;
  long len_local;
  void *buffer_local;
  FileReaderLZSS *this_local;
  
  AvailOut = (long)buffer;
  lStack_30 = len;
LAB_006d81fe:
  do {
    if ((this->Stream).AvailIn != 0) {
      if ((this->Stream).State == STREAM_EMPTY) {
        PrepareBlocks(this);
        goto LAB_006d81fe;
      }
      if ((this->Stream).State == STREAM_BITS) {
        UncompressBlock(this);
      }
    }
    uVar1 = MIN<unsigned_int>((this->Stream).InternalOut,(uint)lStack_30);
    if (uVar1 != 0) {
      memcpy((void *)AvailOut,(this->Stream).WindowData,(ulong)uVar1);
      AvailOut = AvailOut + (ulong)uVar1;
      lStack_30 = lStack_30 - (ulong)uVar1;
      memmove((this->Stream).Window,(this->Stream).Window + uVar1,(ulong)(0x1080 - uVar1));
      (this->Stream).InternalBuffer = (this->Stream).InternalBuffer + -(ulong)uVar1;
      (this->Stream).InternalOut = (this->Stream).InternalOut - uVar1;
    }
    if ((this->Stream).State == STREAM_FINAL) goto LAB_006d837b;
    if (((this->Stream).InternalOut == 0) && ((this->Stream).State == STREAM_FLUSH)) {
      (this->Stream).State = STREAM_EMPTY;
    }
    if ((this->Stream).AvailIn < 2) {
      FillBuffer(this);
    }
    bVar2 = false;
    if (lStack_30 != 0) {
      bVar2 = (this->Stream).State != STREAM_FINAL;
    }
    if (!bVar2) {
LAB_006d837b:
      if (lStack_30 != 0) {
        __assert_fail("AvailOut == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/file_wad.cpp"
                      ,0xe0,"virtual long FileReaderLZSS::Read(void *, long)");
      }
      return AvailOut - (long)buffer;
    }
  } while( true );
}

Assistant:

long Read(void *buffer, long len)
	{

		BYTE *Out = (BYTE*)buffer;
		long AvailOut = len;

		do
		{
			while(Stream.AvailIn)
			{
				if(Stream.State == STREAM_EMPTY)
					PrepareBlocks();
				else if(Stream.State == STREAM_BITS && !UncompressBlock())
					break;
				else
					break;
			}

			unsigned int copy = MIN<unsigned int>(Stream.InternalOut, AvailOut);
			if(copy > 0)
			{
				memcpy(Out, Stream.WindowData, copy);
				Out += copy;
				AvailOut -= copy;

				// Slide our window
				memmove(Stream.Window, Stream.Window+copy, WINDOW_SIZE+INTERNAL_BUFFER_SIZE-copy);
				Stream.InternalBuffer -= copy;
				Stream.InternalOut -= copy;
			}

			if(Stream.State == STREAM_FINAL)
				break;

			if(Stream.InternalOut == 0 && Stream.State == STREAM_FLUSH)
				Stream.State = STREAM_EMPTY;

			if(Stream.AvailIn < 2)
				FillBuffer();
		}
		while(AvailOut && Stream.State != STREAM_FINAL);

		assert(AvailOut == 0);
		return (long)(Out - (BYTE*)buffer);
	}